

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_state.cpp
# Opt level: O3

int cilkg_set_param(char *param,char *value)

{
  int iVar1;
  int iVar2;
  int iVar3;
  unsigned_long min;
  char *pcVar4;
  int *out;
  char not_force_reduce;
  char local_29;
  
  cilkg_get_user_settable_values();
  iVar1 = 3;
  if (value != (char *)0x0 && param != (char *)0x0) {
    iVar1 = strcmp(param,"force reduce");
    if (iVar1 == 0) {
      local_29 = -1;
      pcVar4 = (char *)0x3;
      __cilkrts_metacall(0,3,&local_29);
      if (local_29 == '\0') {
        iVar1 = 4;
      }
      else {
        iVar1 = (anonymous_namespace)::store_bool<int,char>((int *)value,pcVar4);
      }
    }
    else {
      iVar1 = strcmp(param,"nworkers");
      if (iVar1 != 0) {
        iVar1 = strcmp(param,"max user workers");
        if (iVar1 == 0) {
          iVar1 = __cilkrts_hardware_cpu_count();
          if (iVar1 < 1) {
            cilkg_set_param_cold_1();
            goto LAB_0010bd72;
          }
          iVar1 = iVar1 << 4;
          out = (int *)((anonymous_namespace)::global_state_singleton + 8);
          iVar2 = 1;
        }
        else {
          iVar1 = strcmp(param,"local stacks");
          if (iVar1 == 0) {
            out = (int *)((anonymous_namespace)::global_state_singleton + 0x3c);
          }
          else {
            iVar1 = strcmp(param,"shared stacks");
            if (iVar1 != 0) {
              iVar1 = strcmp(param,"nstacks");
              if (iVar1 == 0) {
                if (cilkg_singleton_ptr != (global_state_t *)0x0) {
                  return 4;
                }
                iVar1 = (anonymous_namespace)::store_int<unsigned_int,char>
                                  ((uint *)((anonymous_namespace)::global_state_singleton + 0x3b8),
                                   value,0,0x11c560);
                return iVar1;
              }
              pcVar4 = "stack size";
              iVar1 = strcmp(param,"stack size");
              if (iVar1 != 0) {
                return 1;
              }
              if (cilkg_singleton_ptr != (global_state_t *)0x0) {
                return 4;
              }
              iVar1 = (anonymous_namespace)::store_int<unsigned_long,char>
                                ((unsigned_long *)value,pcVar4,min,0x11c560);
              (anonymous_namespace)::global_state_singleton._960_8_ =
                   cilkos_validate_stack_size((anonymous_namespace)::global_state_singleton._960_8_)
              ;
              return iVar1;
            }
            out = (int *)((anonymous_namespace)::global_state_singleton + 0x40);
          }
          iVar2 = 0;
          iVar1 = 0x2a;
        }
        iVar1 = (anonymous_namespace)::store_int<int,char>(out,value,iVar2,iVar1);
        return iVar1;
      }
      iVar1 = 4;
      if (cilkg_singleton_ptr == (global_state_t *)0x0) {
        iVar2 = __cilkrts_hardware_cpu_count();
        if (iVar2 < 1) {
LAB_0010bd72:
          cilkg_set_param_cold_2();
        }
        iVar3 = __cilkrts_running_under_sequential_ptool();
        iVar1 = iVar2 << 4;
        if (iVar3 != 0) {
          iVar1 = 1;
        }
        iVar1 = (anonymous_namespace)::store_int<int,char>
                          ((int *)((anonymous_namespace)::global_state_singleton + 0x528),value,0,
                           iVar1);
        if (((anonymous_namespace)::global_state_singleton._1320_4_ == 0) &&
           ((anonymous_namespace)::global_state_singleton._1320_4_ = 1, iVar3 == 0)) {
          (anonymous_namespace)::global_state_singleton._1320_4_ = iVar2;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int cilkg_set_param(const char* param, const char* value)
{
    return set_param_imp(cilkg_get_user_settable_values(), param, value);
}